

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Property::Property(Property *this,Attribute *a,bool custom)

{
  bool custom_local;
  Attribute *a_local;
  Property *this_local;
  
  Attribute::Attribute(&this->_attrib,a);
  this->_listOpQual = ResetToExplicit;
  this->_type = EmptyAttrib;
  Relationship::Relationship(&this->_rel);
  std::__cxx11::string::string((string *)&this->_prop_value_type_name);
  this->_has_custom = custom;
  this->_type = Attrib;
  return;
}

Assistant:

Property(const Attribute &a, bool custom = false)
      : _attrib(a), _has_custom(custom) {
    _type = Type::Attrib;
  }